

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::XMLReader::getName(XMLReader *this,XMLBuffer *toFill,bool token)

{
  bool bVar1;
  XMLSize_t local_30;
  XMLSize_t charIndex_start;
  bool token_local;
  XMLBuffer *toFill_local;
  XMLReader *this_local;
  
  if ((this->fCharIndex == this->fCharsAvail) && (bVar1 = refreshCharBuffer(this), !bVar1)) {
    return false;
  }
  local_30 = this->fCharIndex;
  if (!token) {
    if (((ushort)this->fCharBuf[this->fCharIndex] < 0xd800) ||
       (0xdb7f < (ushort)this->fCharBuf[this->fCharIndex])) {
      bVar1 = isFirstNameChar(this,this->fCharBuf[this->fCharIndex]);
      if (!bVar1) {
        return false;
      }
      this->fCharIndex = this->fCharIndex + 1;
    }
    else {
      if (this->fCharIndex + 1 == this->fCharsAvail) {
        bVar1 = refreshCharBuffer(this);
        if (!bVar1) {
          return false;
        }
        local_30 = this->fCharIndex;
      }
      if (((ushort)this->fCharBuf[this->fCharIndex + 1] < 0xdc00) ||
         (0xdfff < (ushort)this->fCharBuf[this->fCharIndex + 1])) {
        return false;
      }
      this->fCharIndex = this->fCharIndex + 2;
    }
  }
  do {
    while (this->fCharsAvail <= this->fCharIndex) {
LAB_0037fdb7:
      if (this->fCharIndex != local_30) {
        this->fCurCol = (this->fCharIndex - local_30) + this->fCurCol;
        XMLBuffer::append(toFill,this->fCharBuf + local_30,this->fCharIndex - local_30);
      }
      if ((this->fCharIndex < this->fCharsAvail) || (bVar1 = refreshCharBuffer(this), !bVar1)) {
        bVar1 = XMLBuffer::isEmpty(toFill);
        return (bool)((bVar1 ^ 0xffU) & 1);
      }
      local_30 = this->fCharIndex;
    }
    if (((ushort)this->fCharBuf[this->fCharIndex] < 0xd800) ||
       (0xdb7f < (ushort)this->fCharBuf[this->fCharIndex])) {
      bVar1 = isNameChar(this,this->fCharBuf[this->fCharIndex]);
      if (!bVar1) goto LAB_0037fdb7;
      this->fCharIndex = this->fCharIndex + 1;
    }
    else {
      if (this->fCharIndex + 1 == this->fCharsAvail) {
        if (this->fCharIndex != local_30) {
          this->fCurCol = (this->fCharIndex - local_30) + this->fCurCol;
          XMLBuffer::append(toFill,this->fCharBuf + local_30,this->fCharIndex - local_30);
        }
        bVar1 = refreshCharBuffer(this);
        if (!bVar1) goto LAB_0037fdb7;
        local_30 = this->fCharIndex;
      }
      if (((ushort)this->fCharBuf[this->fCharIndex + 1] < 0xdc00) ||
         (0xdfff < (ushort)this->fCharBuf[this->fCharIndex + 1])) goto LAB_0037fdb7;
      this->fCharIndex = this->fCharIndex + 2;
    }
  } while( true );
}

Assistant:

bool XMLReader::getName(XMLBuffer& toFill, const bool token)
{
    //  Ok, first lets see if we have chars in the buffer. If not, then lets
    //  reload.
    if (fCharIndex == fCharsAvail)
    {
        if (!refreshCharBuffer())
            return false;
    }

    XMLSize_t charIndex_start = fCharIndex;

    //  Lets check the first char for being a first name char. If not, then
    //  what's the point in living mannnn? Just give up now. We only do this
    //  if its a name and not a name token that they want.
    if (!token)
    {
        if ((fCharBuf[fCharIndex] >= 0xD800) && (fCharBuf[fCharIndex] <= 0xDB7F)) {
            // if there isn't one more char in the buffer, read more data
            if (fCharIndex+1 == fCharsAvail)
            {
                if (!refreshCharBuffer())
                    return false;
                // reset the start buffer to the new location of the cursor
                charIndex_start = fCharIndex;
            }
            if ((fCharBuf[fCharIndex+1] < 0xDC00) || (fCharBuf[fCharIndex+1] > 0xDFFF))
                return false;

            // Looks ok, so lets eat it
            fCharIndex += 2;
        }
        else {
            if (!isFirstNameChar(fCharBuf[fCharIndex]))
                return false;

            // Looks ok, so lets eat it
            fCharIndex ++;
        }

    }

    //  And now we loop until we run out of data in this reader or we hit
    //  a non-name char.
    while (true)
    {
        while (fCharIndex < fCharsAvail)
        {
            //  Check the current char and take it if its a name char. Else
            //  break out.
            if ( (fCharBuf[fCharIndex] >= 0xD800) && (fCharBuf[fCharIndex] <= 0xDB7F) )
            {
                // if there isn't one more char in the buffer, read more data
                if (fCharIndex+1 == fCharsAvail)
                {
                    // but first copy the accepted character(s), and update column
                    if (fCharIndex != charIndex_start)
                    {
                        fCurCol += (XMLFileLoc)(fCharIndex - charIndex_start);
                        toFill.append(&fCharBuf[charIndex_start], fCharIndex - charIndex_start);
                    }

                    if (!refreshCharBuffer())
                        break;

                    charIndex_start = fCharIndex;
                }
                if ( (fCharBuf[fCharIndex+1] < 0xDC00) ||
                        (fCharBuf[fCharIndex+1] > 0xDFFF)  )
                    break;
                fCharIndex += 2;

            }
            else
            {
                if (!isNameChar(fCharBuf[fCharIndex]))
                    break;
                fCharIndex++;
            }
        }

        // we have to copy the accepted character(s), and update column
        if (fCharIndex != charIndex_start)
        {
            fCurCol += (XMLFileLoc)(fCharIndex - charIndex_start);
            toFill.append(&fCharBuf[charIndex_start], fCharIndex - charIndex_start);
        }

        // something is wrong if there is still something in the buffer
        // or if we don't get no more, then break out.
        if ((fCharIndex < fCharsAvail) ||
             !refreshCharBuffer())
            break;

        charIndex_start = fCharIndex;
    }

    return !toFill.isEmpty();
}